

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::StartStruct(Parser *this,string *name,StructDef **dest)

{
  StructDef *pSVar1;
  reference ppSVar2;
  StructDef *in_RCX;
  StructDef *local_a0;
  StructDef **local_98;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_90;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_88 [3];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  StructDef *local_30;
  StructDef *struct_def;
  StructDef **dest_local;
  string *name_local;
  Parser *this_local;
  
  struct_def = in_RCX;
  dest_local = dest;
  name_local = name;
  this_local = this;
  local_30 = LookupCreateStruct((Parser *)name,(string *)dest,true,true);
  if ((local_30->predecl & 1U) == 0) {
    Namespace::GetFullyQualifiedName
              (&local_70,*(Namespace **)((long)&name[0xc].field_2 + 8),(string *)dest_local,1000);
    std::operator+(&local_50,"datatype already exists: ",&local_70);
    Error(this,name);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    local_30->predecl = false;
    std::__cxx11::string::operator=((string *)local_30,(string *)dest_local);
    std::__cxx11::string::operator=
              ((string *)&(local_30->super_Definition).file,(string *)&name[0x38]._M_string_length);
    pSVar1 = local_30;
    local_90._M_current =
         (StructDef **)
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                   ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *)
                    ((long)&name[6].field_2 + 8));
    local_98 = (StructDef **)
               std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                         ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                           *)((long)&name[6].field_2 + 8));
    local_a0 = local_30;
    local_88[0] = std::
                  remove<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,flatbuffers::StructDef*>
                            (local_90,(__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                       )local_98,&local_a0);
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(local_88);
    *ppSVar2 = pSVar1;
    *(StructDef **)&(struct_def->super_Definition).name = local_30;
    anon_unknown_0::NoError();
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartStruct(const std::string &name, StructDef **dest) {
  auto &struct_def = *LookupCreateStruct(name, true, true);
  if (!struct_def.predecl)
    return Error("datatype already exists: " +
                 current_namespace_->GetFullyQualifiedName(name));
  struct_def.predecl = false;
  struct_def.name = name;
  struct_def.file = file_being_parsed_;
  // Move this struct to the back of the vector just in case it was predeclared,
  // to preserve declaration order.
  *std::remove(structs_.vec.begin(), structs_.vec.end(), &struct_def) =
      &struct_def;
  *dest = &struct_def;
  return NoError();
}